

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

char * Curl_all_content_encodings(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  content_encoding *pcVar5;
  content_encoding **ppcVar6;
  char *pcVar7;
  char *__dest;
  
  pcVar5 = &identity_encoding;
  ppcVar6 = encodings;
  sVar4 = 0;
  do {
    ppcVar6 = ppcVar6 + 1;
    iVar1 = Curl_strcasecompare(pcVar5->name,"identity");
    if (iVar1 == 0) {
      sVar2 = strlen(pcVar5->name);
      sVar4 = sVar4 + sVar2 + 2;
    }
    pcVar5 = *ppcVar6;
  } while (pcVar5 != (content_encoding *)0x0);
  if (sVar4 != 0) {
    pcVar3 = (char *)(*Curl_cmalloc)(sVar4);
    if (pcVar3 != (char *)0x0) {
      pcVar5 = &identity_encoding;
      ppcVar6 = encodings;
      __dest = pcVar3;
      do {
        ppcVar6 = ppcVar6 + 1;
        iVar1 = Curl_strcasecompare(pcVar5->name,"identity");
        if (iVar1 == 0) {
          strcpy(__dest,pcVar5->name);
          sVar2 = strlen(__dest);
          pcVar7 = __dest + sVar2;
          __dest = pcVar7 + 2;
          pcVar7[0] = ',';
          pcVar7[1] = ' ';
        }
        pcVar5 = *ppcVar6;
      } while (pcVar5 != (content_encoding *)0x0);
      __dest[-2] = '\0';
    }
    return pcVar3;
  }
  pcVar3 = (*Curl_cstrdup)("identity");
  return pcVar3;
}

Assistant:

char *Curl_all_content_encodings(void)
{
  size_t len = 0;
  const content_encoding * const *cep;
  const content_encoding *ce;
  char *ace;

  for(cep = encodings; *cep; cep++) {
    ce = *cep;
    if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT))
      len += strlen(ce->name) + 2;
  }

  if(!len)
    return strdup(CONTENT_ENCODING_DEFAULT);

  ace = malloc(len);
  if(ace) {
    char *p = ace;
    for(cep = encodings; *cep; cep++) {
      ce = *cep;
      if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT)) {
        strcpy(p, ce->name);
        p += strlen(p);
        *p++ = ',';
        *p++ = ' ';
      }
    }
    p[-2] = '\0';
  }

  return ace;
}